

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_get_system_colors.cxx
# Opt level: O1

int Fl::reload_scheme(void)

{
  byte bVar1;
  Fl_Image *pFVar2;
  int iVar3;
  Fl_Boxtype FVar4;
  Fl_Tiled_Image *this;
  Fl_Window *window;
  uint uVar5;
  ulong uVar6;
  char (*__s) [32];
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  uchar b;
  uchar g;
  uchar r;
  byte local_2b;
  byte local_2a;
  byte local_29;
  
  if ((scheme_ == (char *)0x0) || (iVar3 = fl_ascii_strcasecmp(scheme_,"plastic"), iVar3 != 0)) {
    if ((scheme_ == (char *)0x0) || (iVar3 = fl_ascii_strcasecmp(scheme_,"gtk+"), iVar3 != 0)) {
      if ((scheme_ == (char *)0x0) || (iVar3 = fl_ascii_strcasecmp(scheme_,"gleam"), iVar3 != 0)) {
        if (scheme_bg_ != (Fl_Image *)0x0) {
          (*scheme_bg_->_vptr_Fl_Image[1])();
          scheme_bg_ = (Fl_Image *)0x0;
        }
        set_boxtype(FL_UP_FRAME,fl_up_frame,'\x02','\x02','\x04','\x04');
        set_boxtype(FL_DOWN_FRAME,fl_down_frame,'\x02','\x02','\x04','\x04');
        set_boxtype(FL_THIN_UP_FRAME,fl_thin_up_frame,'\x01','\x01','\x02','\x02');
        set_boxtype(FL_THIN_DOWN_FRAME,fl_thin_down_frame,'\x01','\x01','\x02','\x02');
        set_boxtype(FL_UP_BOX,fl_up_box,'\x02','\x02','\x04','\x04');
        set_boxtype(FL_DOWN_BOX,fl_down_box,'\x02','\x02','\x04','\x04');
        set_boxtype(FL_THIN_UP_BOX,fl_thin_up_box,'\x01','\x01','\x02','\x02');
        set_boxtype(FL_THIN_DOWN_BOX,fl_thin_down_box,'\x01','\x01','\x02','\x02');
        set_boxtype(_FL_ROUND_UP_BOX,fl_round_up_box,'\x03','\x03','\x06','\x06');
        set_boxtype(_FL_ROUND_DOWN_BOX,fl_round_down_box,'\x03','\x03','\x06','\x06');
        goto LAB_001dfc0c;
      }
      if (scheme_bg_ != (Fl_Image *)0x0) {
        (*scheme_bg_->_vptr_Fl_Image[1])();
        scheme_bg_ = (Fl_Image *)0x0;
      }
      FVar4 = fl_define_FL_GLEAM_UP_BOX();
      set_boxtype(FL_UP_FRAME,FVar4 + FL_UP_BOX);
      FVar4 = fl_define_FL_GLEAM_UP_BOX();
      set_boxtype(FL_DOWN_FRAME,FVar4 + FL_DOWN_BOX);
      FVar4 = fl_define_FL_GLEAM_UP_BOX();
      set_boxtype(FL_THIN_UP_FRAME,FVar4 + FL_UP_BOX);
      FVar4 = fl_define_FL_GLEAM_UP_BOX();
      set_boxtype(FL_THIN_DOWN_FRAME,FVar4 + FL_DOWN_BOX);
      FVar4 = fl_define_FL_GLEAM_UP_BOX();
      set_boxtype(FL_UP_BOX,FVar4);
      FVar4 = fl_define_FL_GLEAM_UP_BOX();
      set_boxtype(FL_DOWN_BOX,FVar4 + FL_FLAT_BOX);
      FVar4 = fl_define_FL_GLEAM_UP_BOX();
      set_boxtype(FL_THIN_UP_BOX,FVar4 + FL_UP_FRAME);
      FVar4 = fl_define_FL_GLEAM_UP_BOX();
      set_boxtype(FL_THIN_DOWN_BOX,FVar4 + FL_DOWN_FRAME);
      FVar4 = fl_define_FL_GLEAM_UP_BOX();
      set_boxtype(_FL_ROUND_UP_BOX,FVar4 + FL_THIN_UP_BOX);
      FVar4 = fl_define_FL_GLEAM_UP_BOX();
      FVar4 = FVar4 + FL_THIN_DOWN_BOX;
    }
    else {
      if (scheme_bg_ != (Fl_Image *)0x0) {
        (*scheme_bg_->_vptr_Fl_Image[1])();
        scheme_bg_ = (Fl_Image *)0x0;
      }
      FVar4 = fl_define_FL_GTK_UP_BOX();
      set_boxtype(FL_UP_FRAME,FVar4 + FL_UP_BOX);
      FVar4 = fl_define_FL_GTK_UP_BOX();
      set_boxtype(FL_DOWN_FRAME,FVar4 + FL_DOWN_BOX);
      FVar4 = fl_define_FL_GTK_UP_BOX();
      set_boxtype(FL_THIN_UP_FRAME,FVar4 + FL_THIN_UP_BOX);
      FVar4 = fl_define_FL_GTK_UP_BOX();
      set_boxtype(FL_THIN_DOWN_FRAME,FVar4 + FL_THIN_DOWN_BOX);
      FVar4 = fl_define_FL_GTK_UP_BOX();
      set_boxtype(FL_UP_BOX,FVar4);
      FVar4 = fl_define_FL_GTK_UP_BOX();
      set_boxtype(FL_DOWN_BOX,FVar4 + FL_FLAT_BOX);
      FVar4 = fl_define_FL_GTK_UP_BOX();
      set_boxtype(FL_THIN_UP_BOX,FVar4 + FL_UP_FRAME);
      FVar4 = fl_define_FL_GTK_UP_BOX();
      set_boxtype(FL_THIN_DOWN_BOX,FVar4 + FL_DOWN_FRAME);
      FVar4 = fl_define_FL_GTK_UP_BOX();
      set_boxtype(_FL_ROUND_UP_BOX,FVar4 + FL_THIN_UP_FRAME);
      FVar4 = fl_define_FL_GTK_UP_BOX();
      FVar4 = FVar4 + FL_THIN_DOWN_FRAME;
    }
    set_boxtype(_FL_ROUND_DOWN_BOX,FVar4);
    iVar3 = 0xf;
  }
  else {
    get_color(0x31,&local_29,&local_2a,&local_2b);
    __s = tile_cmap;
    lVar9 = 0;
    do {
      bVar1 = reload_scheme::levels[lVar9];
      uVar5 = (uint)local_29 * (uint)bVar1;
      uVar6 = (ulong)uVar5 / 0xe8;
      if (0xfe < uVar5 / 0xe8) {
        uVar6 = 0xff;
      }
      uVar5 = (uint)local_2a * (uint)bVar1;
      uVar7 = (ulong)uVar5 / 0xe8;
      if (0xfe < uVar5 / 0xe8) {
        uVar7 = 0xff;
      }
      uVar8 = (ulong)((uint)local_2b * (uint)bVar1) / 0xe8;
      if (0xfe < ((uint)local_2b * (uint)bVar1) / 0xe8) {
        uVar8 = 0xff;
      }
      sprintf(*__s,"%c c #%02x%02x%02x",(ulong)(uint)(int)"Oo."[lVar9],uVar6,uVar7,uVar8);
      lVar9 = lVar9 + 1;
      __s = __s + 1;
    } while (lVar9 != 3);
    Fl_Pixmap::uncache(&tile);
    if (scheme_bg_ == (Fl_Image *)0x0) {
      this = (Fl_Tiled_Image *)operator_new(0x38);
      Fl_Tiled_Image::Fl_Tiled_Image(this,&tile.super_Fl_Image,0,0);
      scheme_bg_ = (Fl_Image *)this;
    }
    FVar4 = fl_define_FL_PLASTIC_UP_BOX();
    set_boxtype(FL_UP_FRAME,FVar4 + FL_UP_BOX);
    FVar4 = fl_define_FL_PLASTIC_UP_BOX();
    set_boxtype(FL_DOWN_FRAME,FVar4 + FL_DOWN_BOX);
    FVar4 = fl_define_FL_PLASTIC_UP_BOX();
    set_boxtype(FL_THIN_UP_FRAME,FVar4 + FL_UP_BOX);
    FVar4 = fl_define_FL_PLASTIC_UP_BOX();
    set_boxtype(FL_THIN_DOWN_FRAME,FVar4 + FL_DOWN_BOX);
    FVar4 = fl_define_FL_PLASTIC_UP_BOX();
    set_boxtype(FL_UP_BOX,FVar4);
    FVar4 = fl_define_FL_PLASTIC_UP_BOX();
    set_boxtype(FL_DOWN_BOX,FVar4 + FL_FLAT_BOX);
    FVar4 = fl_define_FL_PLASTIC_UP_BOX();
    set_boxtype(FL_THIN_UP_BOX,FVar4 + FL_UP_FRAME);
    FVar4 = fl_define_FL_PLASTIC_UP_BOX();
    set_boxtype(FL_THIN_DOWN_BOX,FVar4 + FL_DOWN_FRAME);
    FVar4 = fl_define_FL_PLASTIC_UP_BOX();
    set_boxtype(_FL_ROUND_UP_BOX,FVar4 + FL_THIN_UP_BOX);
    FVar4 = fl_define_FL_PLASTIC_UP_BOX();
    set_boxtype(_FL_ROUND_DOWN_BOX,FVar4 + FL_THIN_DOWN_BOX);
LAB_001dfc0c:
    iVar3 = 0x10;
  }
  scrollbar_size(iVar3);
  window = first_window();
  pFVar2 = scheme_bg_;
  while (window != (Fl_Window *)0x0) {
    scheme_bg_ = pFVar2;
    (window->super_Fl_Group).super_Fl_Widget.label_.type = pFVar2 == (Fl_Image *)0x0;
    (window->super_Fl_Group).super_Fl_Widget.label_.align_ = 0x50;
    (window->super_Fl_Group).super_Fl_Widget.label_.image = pFVar2;
    Fl_Widget::redraw((Fl_Widget *)window);
    window = next_window(window);
    pFVar2 = scheme_bg_;
  }
  scheme_bg_ = pFVar2;
  return 1;
}

Assistant:

int Fl::reload_scheme() {
  Fl_Window *win;

  if (scheme_ && !fl_ascii_strcasecmp(scheme_, "plastic")) {
    // Update the tile image to match the background color...
    uchar r, g, b;
    int nr, ng, nb;
    int i;
//    static uchar levels[3] = { 0xff, 0xef, 0xe8 };
    // OSX 10.3 and higher use a background with less contrast...
    static uchar levels[3] = { 0xff, 0xf8, 0xf4 };

    get_color(FL_GRAY, r, g, b);

//    printf("FL_GRAY = 0x%02x 0x%02x 0x%02x\n", r, g, b);

    for (i = 0; i < 3; i ++) {
      nr = levels[i] * r / 0xe8;
      if (nr > 255) nr = 255;

      ng = levels[i] * g / 0xe8;
      if (ng > 255) ng = 255;

      nb = levels[i] * b / 0xe8;
      if (nb > 255) nb = 255;

      sprintf(tile_cmap[i], "%c c #%02x%02x%02x", "Oo."[i], nr, ng, nb);
//      puts(tile_cmap[i]);
    }

    tile.uncache();

    if (!scheme_bg_) scheme_bg_ = new Fl_Tiled_Image(&tile, 0, 0);

    // Load plastic buttons, etc...
    set_boxtype(FL_UP_FRAME,        FL_PLASTIC_UP_FRAME);
    set_boxtype(FL_DOWN_FRAME,      FL_PLASTIC_DOWN_FRAME);
    set_boxtype(FL_THIN_UP_FRAME,   FL_PLASTIC_UP_FRAME);
    set_boxtype(FL_THIN_DOWN_FRAME, FL_PLASTIC_DOWN_FRAME);

    set_boxtype(FL_UP_BOX,          FL_PLASTIC_UP_BOX);
    set_boxtype(FL_DOWN_BOX,        FL_PLASTIC_DOWN_BOX);
    set_boxtype(FL_THIN_UP_BOX,     FL_PLASTIC_THIN_UP_BOX);
    set_boxtype(FL_THIN_DOWN_BOX,   FL_PLASTIC_THIN_DOWN_BOX);
    set_boxtype(_FL_ROUND_UP_BOX,   FL_PLASTIC_ROUND_UP_BOX);
    set_boxtype(_FL_ROUND_DOWN_BOX, FL_PLASTIC_ROUND_DOWN_BOX);

    // Use standard size scrollbars...
    Fl::scrollbar_size(16);
  } else if (scheme_ && !fl_ascii_strcasecmp(scheme_, "gtk+")) {
    // Use a GTK+ inspired look-n-feel...
    if (scheme_bg_) {
      delete scheme_bg_;
      scheme_bg_ = (Fl_Image *)0;
    }

    set_boxtype(FL_UP_FRAME,        FL_GTK_UP_FRAME);
    set_boxtype(FL_DOWN_FRAME,      FL_GTK_DOWN_FRAME);
    set_boxtype(FL_THIN_UP_FRAME,   FL_GTK_THIN_UP_FRAME);
    set_boxtype(FL_THIN_DOWN_FRAME, FL_GTK_THIN_DOWN_FRAME);

    set_boxtype(FL_UP_BOX,          FL_GTK_UP_BOX);
    set_boxtype(FL_DOWN_BOX,        FL_GTK_DOWN_BOX);
    set_boxtype(FL_THIN_UP_BOX,     FL_GTK_THIN_UP_BOX);
    set_boxtype(FL_THIN_DOWN_BOX,   FL_GTK_THIN_DOWN_BOX);
    set_boxtype(_FL_ROUND_UP_BOX,   FL_GTK_ROUND_UP_BOX);
    set_boxtype(_FL_ROUND_DOWN_BOX, FL_GTK_ROUND_DOWN_BOX);

    // Use slightly thinner scrollbars...
    Fl::scrollbar_size(15);
  } else if (scheme_ && !fl_ascii_strcasecmp(scheme_, "gleam")) {
    // Use a GTK+ inspired look-n-feel...
    if (scheme_bg_) {
      delete scheme_bg_;
      scheme_bg_ = (Fl_Image *)0;
    }

    set_boxtype(FL_UP_FRAME,        FL_GLEAM_UP_FRAME);
    set_boxtype(FL_DOWN_FRAME,      FL_GLEAM_DOWN_FRAME);
    set_boxtype(FL_THIN_UP_FRAME,   FL_GLEAM_UP_FRAME);
    set_boxtype(FL_THIN_DOWN_FRAME, FL_GLEAM_DOWN_FRAME);

    set_boxtype(FL_UP_BOX,          FL_GLEAM_UP_BOX);
    set_boxtype(FL_DOWN_BOX,        FL_GLEAM_DOWN_BOX);
    set_boxtype(FL_THIN_UP_BOX,     FL_GLEAM_THIN_UP_BOX);
    set_boxtype(FL_THIN_DOWN_BOX,   FL_GLEAM_THIN_DOWN_BOX);
    set_boxtype(_FL_ROUND_UP_BOX,   FL_GLEAM_ROUND_UP_BOX);
    set_boxtype(_FL_ROUND_DOWN_BOX, FL_GLEAM_ROUND_DOWN_BOX);

    // Use slightly thinner scrollbars...
    Fl::scrollbar_size(15);
  } else {
    // Use the standard FLTK look-n-feel...
    if (scheme_bg_) {
      delete scheme_bg_;
      scheme_bg_ = (Fl_Image *)0;
    }

    set_boxtype(FL_UP_FRAME,        fl_up_frame, D1, D1, D2, D2);
    set_boxtype(FL_DOWN_FRAME,      fl_down_frame, D1, D1, D2, D2);
    set_boxtype(FL_THIN_UP_FRAME,   fl_thin_up_frame, 1, 1, 2, 2);
    set_boxtype(FL_THIN_DOWN_FRAME, fl_thin_down_frame, 1, 1, 2, 2);

    set_boxtype(FL_UP_BOX,          fl_up_box, D1, D1, D2, D2);
    set_boxtype(FL_DOWN_BOX,        fl_down_box, D1, D1, D2, D2);
    set_boxtype(FL_THIN_UP_BOX,     fl_thin_up_box, 1, 1, 2, 2);
    set_boxtype(FL_THIN_DOWN_BOX,   fl_thin_down_box, 1, 1, 2, 2);
    set_boxtype(_FL_ROUND_UP_BOX,   fl_round_up_box, 3, 3, 6, 6);
    set_boxtype(_FL_ROUND_DOWN_BOX, fl_round_down_box, 3, 3, 6, 6);

    // Use standard size scrollbars...
    Fl::scrollbar_size(16);
  }

  // Set (or clear) the background tile for all windows...

  // FIXME: This makes it impossible to assign a background image
  // and/or a label to a window. IMHO we should be able to assign a
  // background image to a window. Currently (as of FLTK 1.3.3) there
  // is the workaround to use a group inside the window to achieve this.
  // See also STR #3075.
  // AlbrechtS, 01 Mar 2015

  for (win = first_window(); win; win = next_window(win)) {
    win->labeltype(scheme_bg_ ? FL_NORMAL_LABEL : FL_NO_LABEL);
    win->align(FL_ALIGN_CENTER | FL_ALIGN_INSIDE | FL_ALIGN_CLIP);
    win->image(scheme_bg_);
    win->redraw();
  }

  return 1;
}